

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O0

SAM_hdr * sam_hdr_new(void)

{
  SAM_hdr *__ptr;
  kh_sam_hdr_t *pkVar1;
  kh_m_s2i_t *pkVar2;
  pool_alloc_t *ppVar3;
  string_alloc_t *psVar4;
  SAM_hdr *sh;
  
  __ptr = (SAM_hdr *)calloc(1,0x498);
  if (__ptr != (SAM_hdr *)0x0) {
    pkVar1 = kh_init_sam_hdr();
    __ptr->h = pkVar1;
    if (__ptr->h != (kh_sam_hdr_t *)0x0) {
      __ptr->ID_cnt = 1;
      __ptr->ref_count = 1;
      __ptr->nref = 0;
      __ptr->ref = (SAM_SQ *)0x0;
      pkVar2 = kh_init_m_s2i();
      __ptr->ref_hash = pkVar2;
      if (pkVar2 != (kh_m_s2i_t *)0x0) {
        __ptr->nrg = 0;
        __ptr->rg = (SAM_RG *)0x0;
        pkVar2 = kh_init_m_s2i();
        __ptr->rg_hash = pkVar2;
        if (pkVar2 != (kh_m_s2i_t *)0x0) {
          __ptr->npg = 0;
          __ptr->pg = (SAM_PG *)0x0;
          __ptr->npg_end_alloc = 0;
          __ptr->npg_end = 0;
          __ptr->pg_end = (int *)0x0;
          pkVar2 = kh_init_m_s2i();
          __ptr->pg_hash = pkVar2;
          if (pkVar2 != (kh_m_s2i_t *)0x0) {
            (__ptr->text).l = 0;
            (__ptr->text).m = 0;
            (__ptr->text).s = (char *)0x0;
            ppVar3 = pool_create(0x18);
            __ptr->tag_pool = ppVar3;
            if (ppVar3 != (pool_alloc_t *)0x0) {
              ppVar3 = pool_create(0x20);
              __ptr->type_pool = ppVar3;
              if (ppVar3 != (pool_alloc_t *)0x0) {
                psVar4 = string_pool_create(0x2000);
                __ptr->str_pool = psVar4;
                if (psVar4 != (string_alloc_t *)0x0) {
                  return __ptr;
                }
              }
            }
          }
        }
      }
    }
    if (__ptr->h != (kh_sam_hdr_t *)0x0) {
      kh_destroy_sam_hdr(__ptr->h);
    }
    if (__ptr->tag_pool != (pool_alloc_t *)0x0) {
      pool_destroy(__ptr->tag_pool);
    }
    if (__ptr->type_pool != (pool_alloc_t *)0x0) {
      pool_destroy(__ptr->type_pool);
    }
    if (__ptr->str_pool != (string_alloc_t *)0x0) {
      string_pool_destroy(__ptr->str_pool);
    }
    free(__ptr);
  }
  return (SAM_hdr *)0x0;
}

Assistant:

SAM_hdr *sam_hdr_new() {
    SAM_hdr *sh = calloc(1, sizeof(*sh));

    if (!sh)
	return NULL;
    
    sh->h = kh_init(sam_hdr);
    if (!sh->h)
	goto err;

    sh->ID_cnt = 1;
    sh->ref_count = 1;

    sh->nref = 0;
    sh->ref  = NULL;
    if (!(sh->ref_hash = kh_init(m_s2i)))
	goto err;

    sh->nrg = 0;
    sh->rg  = NULL;
    if (!(sh->rg_hash = kh_init(m_s2i)))
	goto err;

    sh->npg = 0;
    sh->pg  = NULL;
    sh->npg_end = sh->npg_end_alloc = 0;
    sh->pg_end = NULL;
    if (!(sh->pg_hash = kh_init(m_s2i)))
	goto err;

    KS_INIT(&sh->text);

    if (!(sh->tag_pool = pool_create(sizeof(SAM_hdr_tag))))
	goto err;

    if (!(sh->type_pool = pool_create(sizeof(SAM_hdr_type))))
	goto err;

    if (!(sh->str_pool = string_pool_create(8192)))
	goto err;

    return sh;

 err:
    if (sh->h)
	kh_destroy(sam_hdr, sh->h);

    if (sh->tag_pool)
	pool_destroy(sh->tag_pool);

    if (sh->type_pool)
	pool_destroy(sh->type_pool);

    if (sh->str_pool)
	string_pool_destroy(sh->str_pool);

    free(sh);

    return NULL;
}